

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

bool __thiscall glslang::TType::containsNonOpaque(TType *this)

{
  bool bVar1;
  anon_class_1_0_00000001_for_predicate nonOpaque;
  TType *this_local;
  
  bVar1 = contains<glslang::TType::containsNonOpaque()const::_lambda(glslang::TType_const*)_1_>
                    (this);
  return bVar1;
}

Assistant:

virtual bool containsNonOpaque() const
    {
        const auto nonOpaque = [](const TType* t) {
            switch (t->basicType) {
            case EbtVoid:
            case EbtFloat:
            case EbtDouble:
            case EbtFloat16:
            case EbtInt8:
            case EbtUint8:
            case EbtInt16:
            case EbtUint16:
            case EbtInt:
            case EbtUint:
            case EbtInt64:
            case EbtUint64:
            case EbtBool:
            case EbtReference:
                return true;
            default:
                return false;
            }
        };

        return contains(nonOpaque);
    }